

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh8_factory.cpp
# Opt level: O2

Accel * __thiscall
embree::BVH8Factory::BVH8OBBVirtualCurve8iMB
          (BVH8Factory *this,Scene *scene,IntersectVariant ivariant)

{
  BVH8 *bvh;
  VirtualCurveIntersector *leafIntersector;
  Builder *builder;
  AccelInstance *this_00;
  Intersectors intersectors;
  Intersectors local_140;
  
  bvh = (BVH8 *)BVHN<8>::operator_new(0x240);
  BVHN<8>::BVHN((BVHN<8> *)bvh,(PrimitiveType *)&CurveNiMB<8>::type,scene);
  leafIntersector = (*this->VirtualCurveIntersector8iMB)();
  BVH8OBBVirtualCurveIntersectorsMB(&local_140,this,bvh,leafIntersector,ivariant);
  builder = (*this->BVH8OBBCurve8iMBBuilder_OBB)(bvh,scene,0);
  this_00 = (AccelInstance *)Accel::operator_new(0x180);
  AccelInstance::AccelInstance(this_00,(AccelData *)bvh,builder,&local_140);
  return &this_00->super_Accel;
}

Assistant:

Accel* BVH8Factory::BVH8OBBVirtualCurve8iMB(Scene* scene, IntersectVariant ivariant)
  {
    BVH8* accel = new BVH8(Curve8iMB::type,scene);
    Accel::Intersectors intersectors = BVH8OBBVirtualCurveIntersectorsMB(accel,VirtualCurveIntersector8iMB(),ivariant);
    Builder* builder = BVH8OBBCurve8iMBBuilder_OBB(accel,scene,0);
    return new AccelInstance(accel,builder,intersectors);
  }